

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSolve.c
# Opt level: O1

DdNode * cuddVerifySol(DdManager *bdd,DdNode *F,DdNode **G,int *yIndex,int n)

{
  int *piVar1;
  long lVar2;
  DdNode *f;
  
  piVar1 = (int *)(((ulong)F & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  if (0 < n) {
    lVar2 = (ulong)(uint)n + 1;
    f = F;
    do {
      F = Cudd_bddCompose(bdd,f,G[lVar2 + -2],yIndex[lVar2 + -2]);
      if (F == (DdNode *)0x0) {
        return (DdNode *)0x0;
      }
      piVar1 = (int *)(((ulong)F & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_RecursiveDeref(bdd,f);
      lVar2 = lVar2 + -1;
      f = F;
    } while (1 < lVar2);
  }
  piVar1 = (int *)(((ulong)F & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + -1;
  return F;
}

Assistant:

DdNode *
cuddVerifySol(
  DdManager * bdd,
  DdNode * F /* the left-hand side of the equation */,
  DdNode ** G /* the array of solutions */,
  int * yIndex /* array holding the y variable indices */,
  int  n /* number of unknowns */)
{
    DdNode *w, *R;

    int j;

    R = F;
    cuddRef(R);
    for(j = n - 1; j >= 0; j--) {
         w = Cudd_bddCompose(bdd, R, G[j], yIndex[j]);
        if (w) {
            cuddRef(w);
        } else {
            return(NULL); 
        }
        Cudd_RecursiveDeref(bdd,R);
        R = w;
    }

    cuddDeref(R);

    return(R);

}